

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_abs_vec_mipsel(TCGContext_conflict4 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  byte bVar1;
  TCGv_vec_d TVar2;
  int iVar3;
  TCGv_vec pTVar4;
  TCGArg a_00;
  uintptr_t o;
  uint vece_00;
  TCGType_conflict type;
  uintptr_t o_1;
  
  pTVar4 = r + (long)&tcg_ctx->pool_cur;
  bVar1 = ((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r];
  iVar3 = tcg_can_emit_vec_op_mipsel(tcg_ctx,INDEX_op_abs_vec,(uint)bVar1,vece);
  if (0 < iVar3) {
    vec_gen_2_mipsel(tcg_ctx,INDEX_op_abs_vec,(uint)bVar1,vece,(TCGArg)pTVar4,
                     (TCGArg)(a + (long)&tcg_ctx->pool_cur));
    return;
  }
  if (-1 < iVar3) {
    TVar2 = pTVar4[2];
    type = (TCGType_conflict)(byte)TVar2;
    pTVar4 = tcg_temp_new_vec_mipsel(tcg_ctx,type);
    tcg_can_emit_vec_op_mipsel(tcg_ctx,INDEX_op_sub_vec,(uint)(byte)TVar2,vece);
    iVar3 = tcg_can_emit_vec_op_mipsel(tcg_ctx,INDEX_op_smax_vec,type,vece);
    if (iVar3 < 1) {
      a_00 = (TCGArg)vece;
      iVar3 = tcg_can_emit_vec_op_mipsel(tcg_ctx,INDEX_op_sari_vec,type,vece);
      if (iVar3 < 1) {
        do_dupi_vec(tcg_ctx,pTVar4,0,a_00);
        vece_00 = 2;
        tcg_gen_cmp_vec_mipsel(tcg_ctx,TCG_COND_LT,vece,pTVar4,a,pTVar4);
      }
      else {
        vece_00 = vece;
        tcg_gen_sari_vec_mipsel(tcg_ctx,vece,pTVar4,a,(long)((8 << ((byte)vece & 0x1f)) + -1));
      }
      tcg_gen_xor_vec_mipsel(tcg_ctx,vece_00,r,a,pTVar4);
      tcg_gen_sub_vec_mipsel(tcg_ctx,vece,r,r,pTVar4);
    }
    else {
      tcg_gen_neg_vec_mipsel(tcg_ctx,vece,pTVar4,a);
      tcg_gen_smax_vec_mipsel(tcg_ctx,vece,r,a,pTVar4);
    }
    tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    return;
  }
  tcg_expand_vec_op_mipsel
            (tcg_ctx,INDEX_op_abs_vec,(uint)bVar1,vece,(TCGArg)pTVar4,a + (long)&tcg_ctx->pool_cur);
  return;
}

Assistant:

void tcg_gen_abs_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list;

    tcg_assert_listed_vecop(INDEX_op_abs_vec);
    hold_list = tcg_swap_vecop_list(NULL);

    if (!do_op2(tcg_ctx, vece, r, a, INDEX_op_abs_vec)) {
        TCGType type = tcgv_vec_temp(tcg_ctx, r)->base_type;
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);

        tcg_debug_assert(tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sub_vec, type, vece));
        if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_smax_vec, type, vece) > 0) {
            tcg_gen_neg_vec(tcg_ctx, vece, t, a);
            tcg_gen_smax_vec(tcg_ctx, vece, r, a, t);
        } else {
            if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sari_vec, type, vece) > 0) {
                tcg_gen_sari_vec(tcg_ctx, vece, t, a, (8 << vece) - 1);
            } else {
                do_dupi_vec(tcg_ctx, t, MO_REG, 0);
                tcg_gen_cmp_vec(tcg_ctx, TCG_COND_LT, vece, t, a, t);
            }
            tcg_gen_xor_vec(tcg_ctx, vece, r, a, t);
            tcg_gen_sub_vec(tcg_ctx, vece, r, r, t);
        }

        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}